

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_ssse3.c
# Opt level: O3

void aom_quantize_b_64x64_ssse3
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  ushort *puVar1;
  short *psVar2;
  short *psVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  unkbyte10 Var10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  uint uVar15;
  ulong uVar16;
  short sVar17;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar18 [16];
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  undefined1 in_XMM1 [16];
  undefined1 auVar27 [16];
  ushort uVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar35 [12];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar39;
  short sVar40;
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ushort uVar52;
  ushort uVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ushort uVar54;
  ushort uVar59;
  ushort uVar60;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ushort uVar61;
  undefined1 in_XMM11 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  ushort uVar89;
  short sVar91;
  short sVar93;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ushort uVar90;
  short sVar92;
  short sVar94;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  uint uVar95;
  undefined1 auVar97 [12];
  short sVar105;
  ushort uVar106;
  ushort uVar110;
  undefined1 in_XMM13 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar111;
  undefined1 auVar104 [16];
  undefined1 auVar112 [12];
  short sVar120;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar113 [12];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  short sVar26;
  short sVar34;
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  short sVar72;
  short sVar73;
  short sVar74;
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar96 [12];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  
  auVar76 = *(undefined1 (*) [16])quant_ptr;
  auVar100 = *(undefined1 (*) [16])dequant_ptr;
  auVar63 = *(undefined1 (*) [16])quant_shift_ptr;
  uVar42 = (ushort)(zbin_ptr[4] + 2U) >> 2;
  uVar43 = (ushort)(zbin_ptr[5] + 2U) >> 2;
  uVar44 = (ushort)(zbin_ptr[6] + 2U) >> 2;
  uVar45 = (ushort)(zbin_ptr[7] + 2U) >> 2;
  auVar35._0_2_ = (ushort)(*round_ptr + 2U) >> 2;
  auVar35._2_2_ = (ushort)(round_ptr[1] + 2U) >> 2;
  auVar35._4_2_ = (ushort)(round_ptr[2] + 2U) >> 2;
  auVar35._6_2_ = (ushort)(round_ptr[3] + 2U) >> 2;
  auVar35._8_2_ = (ushort)(round_ptr[4] + 2U) >> 2;
  auVar35._10_2_ = (ushort)(round_ptr[5] + 2U) >> 2;
  auVar78._12_2_ = (ushort)(round_ptr[6] + 2U) >> 2;
  auVar78._0_12_ = auVar35;
  auVar78._14_2_ = (ushort)(round_ptr[7] + 2U) >> 2;
  auVar46._8_4_ = 0xffffffff;
  auVar46._0_8_ = 0xffffffffffffffff;
  auVar46._12_4_ = 0xffffffff;
  auVar50 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar55 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc));
  auVar27 = pabsw(in_XMM1,auVar50);
  auVar62 = pabsw(in_XMM11,auVar55);
  auVar56._0_2_ = -(ushort)(auVar27._0_2_ < (short)((ushort)(*zbin_ptr + 2U) >> 2));
  auVar56._2_2_ = -(ushort)(auVar27._2_2_ < (short)((ushort)(zbin_ptr[1] + 2U) >> 2));
  auVar56._4_2_ = -(ushort)(auVar27._4_2_ < (short)((ushort)(zbin_ptr[2] + 2U) >> 2));
  auVar56._6_2_ = -(ushort)(auVar27._6_2_ < (short)((ushort)(zbin_ptr[3] + 2U) >> 2));
  auVar56._8_2_ = -(ushort)(auVar27._8_2_ < (short)uVar42);
  auVar56._10_2_ = -(ushort)(auVar27._10_2_ < (short)uVar43);
  auVar56._12_2_ = -(ushort)(auVar27._12_2_ < (short)uVar44);
  auVar56._14_2_ = -(ushort)(auVar27._14_2_ < (short)uVar45);
  auVar46 = auVar56 ^ auVar46;
  sVar17 = uVar42 - 1;
  sVar19 = uVar43 - 1;
  sVar20 = uVar44 - 1;
  sVar21 = uVar45 - 1;
  sVar22 = uVar42 - 1;
  sVar23 = uVar43 - 1;
  sVar24 = uVar44 - 1;
  sVar25 = uVar45 - 1;
  uVar42 = (ushort)(sVar17 < auVar62._0_2_);
  auVar48._0_2_ = -uVar42;
  uVar43 = (ushort)(sVar19 < auVar62._2_2_);
  auVar48._2_2_ = -uVar43;
  uVar44 = (ushort)(sVar20 < auVar62._4_2_);
  auVar48._4_2_ = -uVar44;
  uVar45 = (ushort)(sVar21 < auVar62._6_2_);
  auVar48._6_2_ = -uVar45;
  uVar30 = (ushort)(sVar22 < auVar62._8_2_);
  auVar48._8_2_ = -uVar30;
  uVar31 = (ushort)(sVar23 < auVar62._10_2_);
  auVar48._10_2_ = -uVar31;
  uVar32 = (ushort)(sVar24 < auVar62._12_2_);
  auVar48._12_2_ = -uVar32;
  uVar33 = (ushort)(sVar25 < auVar62._14_2_);
  auVar48._14_2_ = -uVar33;
  auVar75 = auVar48 | auVar46;
  auVar38._8_4_ = auVar63._8_4_;
  auVar38._12_4_ = auVar63._12_4_;
  auVar36._8_4_ = auVar35._8_4_;
  auVar36._12_4_ = auVar78._12_4_;
  auVar37._8_4_ = auVar76._8_4_;
  auVar37._12_4_ = auVar76._12_4_;
  auVar41._8_4_ = auVar100._8_4_;
  auVar41._12_4_ = auVar100._12_4_;
  auVar37._0_8_ = auVar76._8_8_;
  auVar38._0_8_ = auVar63._8_8_;
  auVar41._0_8_ = auVar100._8_8_;
  if ((((((((((((((((auVar75 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar75 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar75 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar75 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar75 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar75 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar75 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar75 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar75 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar75 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar75 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar75 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar75[0xf]) {
    auVar76 = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    auVar36._4_4_ = auVar36._12_4_;
    auVar36._0_4_ = auVar36._8_4_;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
  }
  else {
    auVar27 = paddsw(auVar27,auVar78);
    auVar76 = pmulhw(auVar27,auVar76);
    auVar77._0_2_ = auVar76._0_2_ + auVar27._0_2_;
    auVar77._2_2_ = auVar76._2_2_ + auVar27._2_2_;
    auVar77._4_2_ = auVar76._4_2_ + auVar27._4_2_;
    auVar77._6_2_ = auVar76._6_2_ + auVar27._6_2_;
    auVar77._8_2_ = auVar76._8_2_ + auVar27._8_2_;
    auVar77._10_2_ = auVar76._10_2_ + auVar27._10_2_;
    auVar77._12_2_ = auVar76._12_2_ + auVar27._12_2_;
    auVar77._14_2_ = auVar76._14_2_ + auVar27._14_2_;
    sVar26 = auVar63._8_2_;
    sVar34 = auVar63._10_2_;
    sVar39 = auVar63._12_2_;
    sVar40 = auVar63._14_2_;
    auVar76 = pmulhw(auVar77,auVar63);
    auVar27._0_2_ = (ushort)(auVar77._0_2_ * auVar63._0_2_) >> 0xe;
    auVar27._2_2_ = (ushort)(auVar77._2_2_ * auVar63._2_2_) >> 0xe;
    auVar27._4_2_ = (ushort)(auVar77._4_2_ * auVar63._4_2_) >> 0xe;
    auVar27._6_2_ = (ushort)(auVar77._6_2_ * auVar63._6_2_) >> 0xe;
    auVar27._8_2_ = (ushort)(auVar77._8_2_ * sVar26) >> 0xe;
    auVar27._10_2_ = (ushort)(auVar77._10_2_ * sVar34) >> 0xe;
    auVar27._12_2_ = (ushort)(auVar77._12_2_ * sVar39) >> 0xe;
    auVar27._14_2_ = (ushort)(auVar77._14_2_ * sVar40) >> 0xe;
    auVar78 = psllw(auVar76,2);
    auVar36._4_4_ = auVar36._12_4_;
    auVar36._0_4_ = auVar36._8_4_;
    auVar63 = paddsw(auVar62,auVar36);
    auVar76 = pmulhw(auVar63,auVar37);
    auVar62._0_2_ = auVar76._0_2_ + auVar63._0_2_;
    auVar62._2_2_ = auVar76._2_2_ + auVar63._2_2_;
    auVar62._4_2_ = auVar76._4_2_ + auVar63._4_2_;
    auVar62._6_2_ = auVar76._6_2_ + auVar63._6_2_;
    auVar62._8_2_ = auVar76._8_2_ + auVar63._8_2_;
    auVar62._10_2_ = auVar76._10_2_ + auVar63._10_2_;
    auVar62._12_2_ = auVar76._12_2_ + auVar63._12_2_;
    auVar62._14_2_ = auVar76._14_2_ + auVar63._14_2_;
    auVar76 = pmulhw(auVar62,auVar38);
    auVar75._0_2_ = (ushort)(auVar62._0_2_ * sVar26) >> 0xe;
    auVar75._2_2_ = (ushort)(auVar62._2_2_ * sVar34) >> 0xe;
    auVar75._4_2_ = (ushort)(auVar62._4_2_ * sVar39) >> 0xe;
    auVar75._6_2_ = (ushort)(auVar62._6_2_ * sVar40) >> 0xe;
    auVar75._8_2_ = (ushort)(auVar62._8_2_ * sVar26) >> 0xe;
    auVar75._10_2_ = (ushort)(auVar62._10_2_ * sVar34) >> 0xe;
    auVar75._12_2_ = (ushort)(auVar62._12_2_ * sVar39) >> 0xe;
    auVar75._14_2_ = (ushort)(auVar62._14_2_ * sVar40) >> 0xe;
    auVar76 = psllw(auVar76,2);
    auVar27 = psignw(auVar78 | auVar27,auVar50);
    auVar76 = psignw(auVar76 | auVar75,auVar55);
    auVar27 = ~auVar56 & auVar27;
    auVar76 = auVar76 & auVar48;
    auVar63 = psraw(auVar27,0xf);
    auVar67._0_12_ = auVar27._0_12_;
    auVar67._12_2_ = auVar27._6_2_;
    auVar67._14_2_ = auVar63._6_2_;
    auVar66._12_4_ = auVar67._12_4_;
    auVar66._0_10_ = auVar27._0_10_;
    auVar66._10_2_ = auVar63._4_2_;
    sVar73 = auVar27._4_2_;
    auVar65._10_6_ = auVar66._10_6_;
    auVar65._0_8_ = auVar27._0_8_;
    auVar65._8_2_ = sVar73;
    auVar64._8_8_ = auVar65._8_8_;
    auVar64._6_2_ = auVar63._2_2_;
    sVar120 = auVar27._2_2_;
    auVar64._4_2_ = sVar120;
    auVar64._0_2_ = auVar27._0_2_;
    auVar64._2_2_ = auVar63._0_2_;
    uVar89 = auVar27._8_2_;
    sVar91 = auVar27._10_2_;
    sVar93 = auVar27._12_2_;
    auVar79._14_2_ = auVar27._14_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar64;
    *(ushort *)(qcoeff_ptr + 4) = uVar89;
    *(short *)((long)qcoeff_ptr + 0x12) = auVar63._8_2_;
    *(short *)(qcoeff_ptr + 5) = sVar91;
    *(short *)((long)qcoeff_ptr + 0x16) = auVar63._10_2_;
    *(short *)(qcoeff_ptr + 6) = sVar93;
    *(short *)((long)qcoeff_ptr + 0x1a) = auVar63._12_2_;
    *(short *)(qcoeff_ptr + 7) = auVar79._14_2_;
    *(short *)((long)qcoeff_ptr + 0x1e) = auVar63._14_2_;
    auVar63 = psraw(auVar76,0xf);
    auVar71._0_12_ = auVar76._0_12_;
    auVar71._12_2_ = auVar76._6_2_;
    auVar71._14_2_ = auVar63._6_2_;
    auVar70._12_4_ = auVar71._12_4_;
    auVar70._0_10_ = auVar76._0_10_;
    auVar70._10_2_ = auVar63._4_2_;
    sVar74 = auVar76._4_2_;
    auVar69._10_6_ = auVar70._10_6_;
    auVar69._0_8_ = auVar76._0_8_;
    auVar69._8_2_ = sVar74;
    auVar68._8_8_ = auVar69._8_8_;
    auVar68._6_2_ = auVar63._2_2_;
    sVar72 = auVar76._2_2_;
    auVar68._4_2_ = sVar72;
    auVar68._0_2_ = auVar76._0_2_;
    auVar68._2_2_ = auVar63._0_2_;
    uVar90 = auVar76._8_2_;
    sVar92 = auVar76._10_2_;
    sVar94 = auVar76._12_2_;
    auVar80._14_2_ = auVar76._14_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar68;
    *(ushort *)(qcoeff_ptr + 0xc) = uVar90;
    *(short *)((long)qcoeff_ptr + 0x32) = auVar63._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = sVar92;
    *(short *)((long)qcoeff_ptr + 0x36) = auVar63._10_2_;
    *(short *)(qcoeff_ptr + 0xe) = sVar94;
    *(short *)((long)qcoeff_ptr + 0x3a) = auVar63._12_2_;
    *(short *)(qcoeff_ptr + 0xf) = auVar80._14_2_;
    *(short *)((long)qcoeff_ptr + 0x3e) = auVar63._14_2_;
    auVar78 = pabsw(auVar63,auVar27);
    auVar11._10_2_ = sVar73;
    auVar11._0_10_ = (unkuint10)0;
    auVar63._2_12_ = SUB1612(ZEXT616(CONCAT42(auVar11._8_4_,sVar120)) << 0x30,4);
    auVar63._0_2_ = auVar64._0_2_;
    auVar63._14_2_ = 0;
    auVar79._0_10_ = (unkuint10)CONCAT24(sVar91,(uint)uVar89) << 0x10;
    auVar79._10_2_ = sVar93;
    auVar79._12_2_ = 0;
    sVar105 = auVar78._6_2_ * auVar100._6_2_;
    sVar26 = auVar100._8_2_;
    sVar34 = auVar100._10_2_;
    sVar39 = auVar100._12_2_;
    sVar40 = auVar100._14_2_;
    auVar56 = pmulhw(auVar78,auVar100);
    uVar15 = CONCAT22(auVar56._6_2_,sVar105);
    Var10 = CONCAT64(CONCAT42(uVar15,auVar56._4_2_),CONCAT22(auVar78._4_2_ * auVar100._4_2_,sVar105)
                    );
    auVar6._4_8_ = (long)((unkuint10)Var10 >> 0x10);
    auVar6._2_2_ = auVar56._2_2_;
    auVar6._0_2_ = auVar78._2_2_ * auVar100._2_2_;
    uVar95 = CONCAT22(auVar56._8_2_,auVar78._8_2_ * sVar26);
    auVar96._0_8_ = CONCAT26(auVar56._10_2_,CONCAT24(auVar78._10_2_ * sVar34,uVar95));
    auVar96._8_2_ = auVar78._12_2_ * sVar39;
    auVar96._10_2_ = auVar56._12_2_;
    auVar98._12_2_ = auVar78._14_2_ * sVar40;
    auVar98._0_12_ = auVar96;
    auVar98._14_2_ = auVar56._14_2_;
    auVar114._0_4_ = CONCAT22(auVar56._0_2_,auVar78._0_2_ * auVar100._0_2_) >> 2;
    auVar114._4_4_ = auVar6._0_4_ >> 2;
    auVar114._8_4_ = (uint)((unkuint10)Var10 >> 0x10) >> 2;
    auVar114._12_4_ = uVar15 >> 2;
    auVar63 = psignd(auVar114,auVar63 << 0x10);
    auVar99._0_4_ = uVar95 >> 2;
    auVar99._4_4_ = (uint)((ulong)auVar96._0_8_ >> 0x22);
    auVar99._8_4_ = auVar96._8_4_ >> 2;
    auVar99._12_4_ = auVar98._12_4_ >> 2;
    auVar100 = psignd(auVar99,auVar79);
    *(undefined1 (*) [16])dqcoeff_ptr = auVar63;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = auVar100;
    auVar63 = pabsw(auVar56,auVar76);
    auVar12._10_2_ = sVar74;
    auVar12._0_10_ = (unkuint10)0;
    auVar100._2_12_ = SUB1612(ZEXT616(CONCAT42(auVar12._8_4_,sVar72)) << 0x30,4);
    auVar100._0_2_ = auVar68._0_2_;
    auVar100._14_2_ = 0;
    auVar80._0_10_ = (unkuint10)CONCAT24(sVar92,(uint)uVar90) << 0x10;
    auVar80._10_2_ = sVar94;
    auVar80._12_2_ = 0;
    sVar105 = auVar63._6_2_ * sVar40;
    auVar78 = pmulhw(auVar63,auVar41);
    uVar15 = CONCAT22(auVar78._6_2_,sVar105);
    Var10 = CONCAT64(CONCAT42(uVar15,auVar78._4_2_),CONCAT22(auVar63._4_2_ * sVar39,sVar105));
    auVar7._4_8_ = (long)((unkuint10)Var10 >> 0x10);
    auVar7._2_2_ = auVar78._2_2_;
    auVar7._0_2_ = auVar63._2_2_ * sVar34;
    uVar95 = CONCAT22(auVar78._8_2_,auVar63._8_2_ * sVar26);
    auVar97._0_8_ = CONCAT26(auVar78._10_2_,CONCAT24(auVar63._10_2_ * sVar34,uVar95));
    auVar97._8_2_ = auVar63._12_2_ * sVar39;
    auVar97._10_2_ = auVar78._12_2_;
    auVar101._12_2_ = auVar63._14_2_ * sVar40;
    auVar101._0_12_ = auVar97;
    auVar101._14_2_ = auVar78._14_2_;
    auVar115._0_4_ = CONCAT22(auVar78._0_2_,auVar63._0_2_ * sVar26) >> 2;
    auVar115._4_4_ = auVar7._0_4_ >> 2;
    auVar115._8_4_ = (uint)((unkuint10)Var10 >> 0x10) >> 2;
    auVar115._12_4_ = uVar15 >> 2;
    auVar100 = psignd(auVar115,auVar100 << 0x10);
    auVar102._0_4_ = uVar95 >> 2;
    auVar102._4_4_ = (uint)((ulong)auVar97._0_8_ >> 0x22);
    auVar102._8_4_ = auVar97._8_4_ >> 2;
    auVar102._12_4_ = auVar101._12_4_ >> 2;
    in_XMM13 = psignd(auVar102,auVar80);
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = auVar100;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = in_XMM13;
    auVar55._0_2_ = *iscan - auVar46._0_2_;
    auVar55._2_2_ = iscan[1] - auVar46._2_2_;
    auVar55._4_2_ = iscan[2] - auVar46._4_2_;
    auVar55._6_2_ = iscan[3] - auVar46._6_2_;
    auVar55._8_2_ = iscan[4] - auVar46._8_2_;
    auVar55._10_2_ = iscan[5] - auVar46._10_2_;
    auVar55._12_2_ = iscan[6] - auVar46._12_2_;
    auVar55._14_2_ = iscan[7] - auVar46._14_2_;
    auVar50._0_2_ = -(ushort)(auVar64._0_2_ == 0);
    auVar50._2_2_ = -(ushort)(sVar120 == 0);
    auVar50._4_2_ = -(ushort)(sVar73 == 0);
    auVar50._6_2_ = -(ushort)(auVar27._6_2_ == 0);
    auVar50._8_2_ = -(ushort)(uVar89 == 0);
    auVar50._10_2_ = -(ushort)(sVar91 == 0);
    auVar50._12_2_ = -(ushort)(sVar93 == 0);
    auVar50._14_2_ = -(ushort)(auVar79._14_2_ == 0);
    auVar100 = ~auVar50 & auVar55;
    uVar42 = ~-(ushort)(auVar68._0_2_ == 0) & iscan[8] + uVar42;
    uVar43 = ~-(ushort)(sVar72 == 0) & iscan[9] + uVar43;
    uVar44 = ~-(ushort)(sVar74 == 0) & iscan[10] + uVar44;
    uVar45 = ~-(ushort)(auVar76._6_2_ == 0) & iscan[0xb] + uVar45;
    uVar30 = ~-(ushort)(uVar90 == 0) & iscan[0xc] + uVar30;
    uVar31 = ~-(ushort)(sVar92 == 0) & iscan[0xd] + uVar31;
    uVar32 = ~-(ushort)(sVar94 == 0) & iscan[0xe] + uVar32;
    uVar33 = ~-(ushort)(auVar80._14_2_ == 0) & iscan[0xf] + uVar33;
    sVar26 = auVar100._0_2_;
    auVar76._0_2_ = (ushort)((short)uVar42 < sVar26) * sVar26 | ((short)uVar42 >= sVar26) * uVar42;
    sVar26 = auVar100._2_2_;
    auVar76._2_2_ = (ushort)((short)uVar43 < sVar26) * sVar26 | ((short)uVar43 >= sVar26) * uVar43;
    sVar26 = auVar100._4_2_;
    auVar76._4_2_ = (ushort)((short)uVar44 < sVar26) * sVar26 | ((short)uVar44 >= sVar26) * uVar44;
    sVar26 = auVar100._6_2_;
    auVar76._6_2_ = (ushort)((short)uVar45 < sVar26) * sVar26 | ((short)uVar45 >= sVar26) * uVar45;
    sVar26 = auVar100._8_2_;
    auVar76._8_2_ = (ushort)((short)uVar30 < sVar26) * sVar26 | ((short)uVar30 >= sVar26) * uVar30;
    sVar26 = auVar100._10_2_;
    auVar76._10_2_ = (ushort)((short)uVar31 < sVar26) * sVar26 | ((short)uVar31 >= sVar26) * uVar31;
    sVar26 = auVar100._12_2_;
    auVar76._12_2_ = (ushort)((short)uVar32 < sVar26) * sVar26 | ((short)uVar32 >= sVar26) * uVar32;
    sVar26 = auVar100._14_2_;
    auVar76._14_2_ = (ushort)((short)uVar33 < sVar26) * sVar26 | ((short)uVar33 >= sVar26) * uVar33;
  }
  uVar16 = 0;
  do {
    auVar27 = packssdw(*(undefined1 (*) [16])(coeff_ptr + uVar16 + 0x10),
                       *(undefined1 (*) [16])(coeff_ptr + uVar16 + 0x14));
    auVar63 = packssdw(*(undefined1 (*) [16])(coeff_ptr + uVar16 + 0x18),
                       *(undefined1 (*) [16])(coeff_ptr + uVar16 + 0x1c));
    auVar55 = pabsw(auVar55,auVar27);
    in_XMM13 = pabsw(in_XMM13,auVar63);
    uVar42 = (ushort)(sVar17 < auVar55._0_2_);
    auVar47._0_2_ = -uVar42;
    uVar44 = (ushort)(sVar19 < auVar55._2_2_);
    auVar47._2_2_ = -uVar44;
    uVar30 = (ushort)(sVar20 < auVar55._4_2_);
    auVar47._4_2_ = -uVar30;
    uVar32 = (ushort)(sVar21 < auVar55._6_2_);
    auVar47._6_2_ = -uVar32;
    uVar89 = (ushort)(sVar22 < auVar55._8_2_);
    auVar47._8_2_ = -uVar89;
    uVar52 = (ushort)(sVar23 < auVar55._10_2_);
    auVar47._10_2_ = -uVar52;
    uVar53 = (ushort)(sVar24 < auVar55._12_2_);
    auVar47._12_2_ = -uVar53;
    uVar54 = (ushort)(sVar25 < auVar55._14_2_);
    auVar47._14_2_ = -uVar54;
    uVar43 = (ushort)(sVar17 < in_XMM13._0_2_);
    auVar49._0_2_ = -uVar43;
    uVar45 = (ushort)(sVar19 < in_XMM13._2_2_);
    auVar49._2_2_ = -uVar45;
    uVar31 = (ushort)(sVar20 < in_XMM13._4_2_);
    auVar49._4_2_ = -uVar31;
    uVar33 = (ushort)(sVar21 < in_XMM13._6_2_);
    auVar49._6_2_ = -uVar33;
    uVar90 = (ushort)(sVar22 < in_XMM13._8_2_);
    auVar49._8_2_ = -uVar90;
    uVar59 = (ushort)(sVar23 < in_XMM13._10_2_);
    auVar49._10_2_ = -uVar59;
    uVar60 = (ushort)(sVar24 < in_XMM13._12_2_);
    auVar49._12_2_ = -uVar60;
    uVar61 = (ushort)(sVar25 < in_XMM13._14_2_);
    auVar49._14_2_ = -uVar61;
    auVar100 = auVar49 | auVar47;
    if ((((((((((((((((auVar100 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar100 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar100 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar100 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar100 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar100 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar100 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar100 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar100 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar100 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar100 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar100 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar100 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar100 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar100 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar100[0xf])
    {
      *(undefined1 (*) [16])(qcoeff_ptr + uVar16 + 0x1c) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar16 + 0x18) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar16 + 0x14) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar16 + 0x10) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar16 + 0x1c) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar16 + 0x18) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar16 + 0x14) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar16 + 0x10) = (undefined1  [16])0x0;
    }
    else {
      auVar78 = paddsw(auVar55,auVar36);
      auVar100 = pmulhw(auVar78,auVar37);
      auVar51._0_2_ = auVar100._0_2_ + auVar78._0_2_;
      auVar51._2_2_ = auVar100._2_2_ + auVar78._2_2_;
      auVar51._4_2_ = auVar100._4_2_ + auVar78._4_2_;
      auVar51._6_2_ = auVar100._6_2_ + auVar78._6_2_;
      auVar51._8_2_ = auVar100._8_2_ + auVar78._8_2_;
      auVar51._10_2_ = auVar100._10_2_ + auVar78._10_2_;
      auVar51._12_2_ = auVar100._12_2_ + auVar78._12_2_;
      auVar51._14_2_ = auVar100._14_2_ + auVar78._14_2_;
      auVar100 = pmulhw(auVar51,auVar38);
      auVar57._0_2_ = (ushort)(auVar51._0_2_ * auVar38._0_2_) >> 0xe;
      auVar57._2_2_ = (ushort)(auVar51._2_2_ * auVar38._2_2_) >> 0xe;
      auVar57._4_2_ = (ushort)(auVar51._4_2_ * auVar38._4_2_) >> 0xe;
      auVar57._6_2_ = (ushort)(auVar51._6_2_ * auVar38._6_2_) >> 0xe;
      auVar57._8_2_ = (ushort)(auVar51._8_2_ * auVar38._8_2_) >> 0xe;
      auVar57._10_2_ = (ushort)(auVar51._10_2_ * auVar38._10_2_) >> 0xe;
      auVar57._12_2_ = (ushort)(auVar51._12_2_ * auVar38._12_2_) >> 0xe;
      auVar57._14_2_ = (ushort)(auVar51._14_2_ * auVar38._14_2_) >> 0xe;
      auVar100 = psllw(auVar100,2);
      auVar56 = paddsw(in_XMM13,auVar36);
      auVar78 = pmulhw(auVar56,auVar37);
      auVar58._0_2_ = auVar78._0_2_ + auVar56._0_2_;
      auVar58._2_2_ = auVar78._2_2_ + auVar56._2_2_;
      auVar58._4_2_ = auVar78._4_2_ + auVar56._4_2_;
      auVar58._6_2_ = auVar78._6_2_ + auVar56._6_2_;
      auVar58._8_2_ = auVar78._8_2_ + auVar56._8_2_;
      auVar58._10_2_ = auVar78._10_2_ + auVar56._10_2_;
      auVar58._12_2_ = auVar78._12_2_ + auVar56._12_2_;
      auVar58._14_2_ = auVar78._14_2_ + auVar56._14_2_;
      auVar78 = pmulhw(auVar58,auVar38);
      auVar103._0_2_ = (ushort)(auVar58._0_2_ * auVar38._0_2_) >> 0xe;
      auVar103._2_2_ = (ushort)(auVar58._2_2_ * auVar38._2_2_) >> 0xe;
      auVar103._4_2_ = (ushort)(auVar58._4_2_ * auVar38._4_2_) >> 0xe;
      auVar103._6_2_ = (ushort)(auVar58._6_2_ * auVar38._6_2_) >> 0xe;
      auVar103._8_2_ = (ushort)(auVar58._8_2_ * auVar38._8_2_) >> 0xe;
      auVar103._10_2_ = (ushort)(auVar58._10_2_ * auVar38._10_2_) >> 0xe;
      auVar103._12_2_ = (ushort)(auVar58._12_2_ * auVar38._12_2_) >> 0xe;
      auVar103._14_2_ = (ushort)(auVar58._14_2_ * auVar38._14_2_) >> 0xe;
      auVar78 = psllw(auVar78,2);
      auVar100 = psignw(auVar100 | auVar57,auVar27);
      auVar63 = psignw(auVar78 | auVar103,auVar63);
      auVar100 = auVar100 & auVar47;
      auVar63 = auVar63 & auVar49;
      auVar27 = psraw(auVar100,0xf);
      auVar84._0_12_ = auVar100._0_12_;
      auVar84._12_2_ = auVar100._6_2_;
      auVar84._14_2_ = auVar27._6_2_;
      auVar83._12_4_ = auVar84._12_4_;
      auVar83._0_10_ = auVar100._0_10_;
      auVar83._10_2_ = auVar27._4_2_;
      sVar39 = auVar100._4_2_;
      auVar82._10_6_ = auVar83._10_6_;
      auVar82._0_8_ = auVar100._0_8_;
      auVar82._8_2_ = sVar39;
      auVar81._8_8_ = auVar82._8_8_;
      auVar81._6_2_ = auVar27._2_2_;
      sVar26 = auVar100._2_2_;
      auVar81._4_2_ = sVar26;
      auVar81._0_2_ = auVar100._0_2_;
      auVar81._2_2_ = auVar27._0_2_;
      uVar106 = auVar100._8_2_;
      uVar108 = auVar100._10_2_;
      uVar110 = auVar100._12_2_;
      auVar104._14_2_ = auVar100._14_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar16 + 0x10) = auVar81;
      puVar1 = (ushort *)(qcoeff_ptr + uVar16 + 0x14);
      *puVar1 = uVar106;
      puVar1[1] = auVar27._8_2_;
      puVar1[2] = uVar108;
      puVar1[3] = auVar27._10_2_;
      puVar1[4] = uVar110;
      puVar1[5] = auVar27._12_2_;
      puVar1[6] = auVar104._14_2_;
      puVar1[7] = auVar27._14_2_;
      auVar27 = psraw(auVar63,0xf);
      auVar88._0_12_ = auVar63._0_12_;
      auVar88._12_2_ = auVar63._6_2_;
      auVar88._14_2_ = auVar27._6_2_;
      auVar87._12_4_ = auVar88._12_4_;
      auVar87._0_10_ = auVar63._0_10_;
      auVar87._10_2_ = auVar27._4_2_;
      sVar40 = auVar63._4_2_;
      auVar86._10_6_ = auVar87._10_6_;
      auVar86._0_8_ = auVar63._0_8_;
      auVar86._8_2_ = sVar40;
      auVar85._8_8_ = auVar86._8_8_;
      auVar85._6_2_ = auVar27._2_2_;
      sVar34 = auVar63._2_2_;
      auVar85._4_2_ = sVar34;
      auVar85._0_2_ = auVar63._0_2_;
      auVar85._2_2_ = auVar27._0_2_;
      uVar107 = auVar63._8_2_;
      uVar109 = auVar63._10_2_;
      uVar111 = auVar63._12_2_;
      in_XMM13._14_2_ = auVar63._14_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar16 + 0x18) = auVar85;
      puVar1 = (ushort *)(qcoeff_ptr + uVar16 + 0x1c);
      *puVar1 = uVar107;
      puVar1[1] = auVar27._8_2_;
      puVar1[2] = uVar109;
      puVar1[3] = auVar27._10_2_;
      puVar1[4] = uVar111;
      puVar1[5] = auVar27._12_2_;
      puVar1[6] = in_XMM13._14_2_;
      puVar1[7] = auVar27._14_2_;
      auVar27 = pabsw(auVar27,auVar100);
      auVar13._10_2_ = sVar39;
      auVar13._0_10_ = (unkuint10)0;
      auVar4._2_12_ = SUB1612(ZEXT616(CONCAT42(auVar13._8_4_,sVar26)) << 0x30,4);
      auVar4._0_2_ = auVar81._0_2_;
      auVar4._14_2_ = 0;
      auVar104._0_10_ = (unkuint10)CONCAT24(uVar108,(uint)uVar106) << 0x10;
      auVar104._10_2_ = uVar110;
      auVar104._12_2_ = 0;
      sVar120 = auVar27._6_2_ * auVar41._6_2_;
      auVar78 = pmulhw(auVar27,auVar41);
      uVar15 = CONCAT22(auVar78._6_2_,sVar120);
      Var10 = CONCAT64(CONCAT42(uVar15,auVar78._4_2_),
                       CONCAT22(auVar27._4_2_ * auVar41._4_2_,sVar120));
      auVar8._4_8_ = (long)((unkuint10)Var10 >> 0x10);
      auVar8._2_2_ = auVar78._2_2_;
      auVar8._0_2_ = auVar27._2_2_ * auVar41._2_2_;
      uVar95 = CONCAT22(auVar78._8_2_,auVar27._8_2_ * auVar41._8_2_);
      auVar112._0_8_ = CONCAT26(auVar78._10_2_,CONCAT24(auVar27._10_2_ * auVar41._10_2_,uVar95));
      auVar112._8_2_ = auVar27._12_2_ * auVar41._12_2_;
      auVar112._10_2_ = auVar78._12_2_;
      auVar116._12_2_ = auVar27._14_2_ * auVar41._14_2_;
      auVar116._0_12_ = auVar112;
      auVar116._14_2_ = auVar78._14_2_;
      auVar121._0_4_ = CONCAT22(auVar78._0_2_,auVar27._0_2_ * auVar41._0_2_) >> 2;
      auVar121._4_4_ = auVar8._0_4_ >> 2;
      auVar121._8_4_ = (uint)((unkuint10)Var10 >> 0x10) >> 2;
      auVar121._12_4_ = uVar15 >> 2;
      auVar56 = psignd(auVar121,auVar4 << 0x10);
      auVar117._0_4_ = uVar95 >> 2;
      auVar117._4_4_ = (uint)((ulong)auVar112._0_8_ >> 0x22);
      auVar117._8_4_ = auVar112._8_4_ >> 2;
      auVar117._12_4_ = auVar116._12_4_ >> 2;
      auVar27 = psignd(auVar117,auVar104);
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar16 + 0x10) = auVar56;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar16 + 0x14) = auVar27;
      auVar27 = pabsw(auVar78,auVar63);
      auVar14._10_2_ = sVar40;
      auVar14._0_10_ = (unkuint10)0;
      auVar5._2_12_ = SUB1612(ZEXT616(CONCAT42(auVar14._8_4_,sVar34)) << 0x30,4);
      auVar5._0_2_ = auVar85._0_2_;
      auVar5._14_2_ = 0;
      in_XMM13._0_10_ = (unkuint10)CONCAT24(uVar109,(uint)uVar107) << 0x10;
      in_XMM13._10_2_ = uVar111;
      in_XMM13._12_2_ = 0;
      sVar120 = auVar27._6_2_ * auVar41._6_2_;
      auVar78 = pmulhw(auVar27,auVar41);
      uVar15 = CONCAT22(auVar78._6_2_,sVar120);
      Var10 = CONCAT64(CONCAT42(uVar15,auVar78._4_2_),
                       CONCAT22(auVar27._4_2_ * auVar41._4_2_,sVar120));
      auVar9._4_8_ = (long)((unkuint10)Var10 >> 0x10);
      auVar9._2_2_ = auVar78._2_2_;
      auVar9._0_2_ = auVar27._2_2_ * auVar41._2_2_;
      uVar95 = CONCAT22(auVar78._8_2_,auVar27._8_2_ * auVar41._8_2_);
      auVar113._0_8_ = CONCAT26(auVar78._10_2_,CONCAT24(auVar27._10_2_ * auVar41._10_2_,uVar95));
      auVar113._8_2_ = auVar27._12_2_ * auVar41._12_2_;
      auVar113._10_2_ = auVar78._12_2_;
      auVar118._12_2_ = auVar27._14_2_ * auVar41._14_2_;
      auVar118._0_12_ = auVar113;
      auVar118._14_2_ = auVar78._14_2_;
      auVar122._0_4_ = CONCAT22(auVar78._0_2_,auVar27._0_2_ * auVar41._0_2_) >> 2;
      auVar122._4_4_ = auVar9._0_4_ >> 2;
      auVar122._8_4_ = (uint)((unkuint10)Var10 >> 0x10) >> 2;
      auVar122._12_4_ = uVar15 >> 2;
      auVar78 = psignd(auVar122,auVar5 << 0x10);
      auVar119._0_4_ = uVar95 >> 2;
      auVar119._4_4_ = (uint)((ulong)auVar113._0_8_ >> 0x22);
      auVar119._8_4_ = auVar113._8_4_ >> 2;
      auVar119._12_4_ = auVar118._12_4_ >> 2;
      auVar27 = psignd(auVar119,in_XMM13);
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar16 + 0x18) = auVar78;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar16 + 0x1c) = auVar27;
      psVar2 = iscan + uVar16 + 0x10;
      psVar3 = iscan + uVar16 + 0x18;
      uVar42 = ~-(ushort)(auVar81._0_2_ == 0) & *psVar2 + uVar42;
      uVar44 = ~-(ushort)(sVar26 == 0) & psVar2[1] + uVar44;
      uVar30 = ~-(ushort)(sVar39 == 0) & psVar2[2] + uVar30;
      uVar32 = ~-(ushort)(auVar100._6_2_ == 0) & psVar2[3] + uVar32;
      uVar89 = ~-(ushort)(uVar106 == 0) & psVar2[4] + uVar89;
      uVar52 = ~-(ushort)(uVar108 == 0) & psVar2[5] + uVar52;
      uVar53 = ~-(ushort)(uVar110 == 0) & psVar2[6] + uVar53;
      uVar54 = ~-(ushort)(auVar104._14_2_ == 0) & psVar2[7] + uVar54;
      uVar43 = ~-(ushort)(auVar85._0_2_ == 0) & *psVar3 + uVar43;
      uVar45 = ~-(ushort)(sVar34 == 0) & psVar3[1] + uVar45;
      uVar31 = ~-(ushort)(sVar40 == 0) & psVar3[2] + uVar31;
      uVar33 = ~-(ushort)(auVar63._6_2_ == 0) & psVar3[3] + uVar33;
      uVar90 = ~-(ushort)(uVar107 == 0) & psVar3[4] + uVar90;
      uVar59 = ~-(ushort)(uVar109 == 0) & psVar3[5] + uVar59;
      uVar60 = ~-(ushort)(uVar111 == 0) & psVar3[6] + uVar60;
      uVar61 = ~-(ushort)(in_XMM13._14_2_ == 0) & psVar3[7] + uVar61;
      auVar55._0_2_ =
           ((short)uVar43 < (short)uVar42) * uVar42 | ((short)uVar43 >= (short)uVar42) * uVar43;
      auVar55._2_2_ =
           ((short)uVar45 < (short)uVar44) * uVar44 | ((short)uVar45 >= (short)uVar44) * uVar45;
      auVar55._4_2_ =
           ((short)uVar31 < (short)uVar30) * uVar30 | ((short)uVar31 >= (short)uVar30) * uVar31;
      auVar55._6_2_ =
           ((short)uVar33 < (short)uVar32) * uVar32 | ((short)uVar33 >= (short)uVar32) * uVar33;
      auVar55._8_2_ =
           ((short)uVar90 < (short)uVar89) * uVar89 | ((short)uVar90 >= (short)uVar89) * uVar90;
      auVar55._10_2_ =
           ((short)uVar59 < (short)uVar52) * uVar52 | ((short)uVar59 >= (short)uVar52) * uVar59;
      auVar55._12_2_ =
           ((short)uVar60 < (short)uVar53) * uVar53 | ((short)uVar60 >= (short)uVar53) * uVar60;
      auVar55._14_2_ =
           ((short)uVar61 < (short)uVar54) * uVar54 | ((short)uVar61 >= (short)uVar54) * uVar61;
      sVar26 = auVar76._0_2_;
      auVar28._0_2_ =
           (sVar26 < (short)auVar55._0_2_) * auVar55._0_2_ |
           (ushort)(sVar26 >= (short)auVar55._0_2_) * sVar26;
      sVar26 = auVar76._2_2_;
      auVar28._2_2_ =
           (sVar26 < (short)auVar55._2_2_) * auVar55._2_2_ |
           (ushort)(sVar26 >= (short)auVar55._2_2_) * sVar26;
      sVar26 = auVar76._4_2_;
      auVar28._4_2_ =
           (sVar26 < (short)auVar55._4_2_) * auVar55._4_2_ |
           (ushort)(sVar26 >= (short)auVar55._4_2_) * sVar26;
      sVar26 = auVar76._6_2_;
      auVar28._6_2_ =
           (sVar26 < (short)auVar55._6_2_) * auVar55._6_2_ |
           (ushort)(sVar26 >= (short)auVar55._6_2_) * sVar26;
      sVar26 = auVar76._8_2_;
      auVar28._8_2_ =
           (sVar26 < (short)auVar55._8_2_) * auVar55._8_2_ |
           (ushort)(sVar26 >= (short)auVar55._8_2_) * sVar26;
      sVar26 = auVar76._10_2_;
      auVar28._10_2_ =
           (sVar26 < (short)auVar55._10_2_) * auVar55._10_2_ |
           (ushort)(sVar26 >= (short)auVar55._10_2_) * sVar26;
      sVar26 = auVar76._12_2_;
      sVar34 = auVar76._14_2_;
      auVar28._12_2_ =
           (sVar26 < (short)auVar55._12_2_) * auVar55._12_2_ |
           (ushort)(sVar26 >= (short)auVar55._12_2_) * sVar26;
      auVar28._14_2_ =
           (sVar34 < (short)auVar55._14_2_) * auVar55._14_2_ |
           (ushort)(sVar34 >= (short)auVar55._14_2_) * sVar34;
      auVar76 = auVar28;
    }
    uVar16 = uVar16 + 0x10;
  } while (uVar16 < 0x3f0);
  sVar17 = auVar76._0_2_;
  sVar21 = auVar76._8_2_;
  auVar18._0_2_ = (ushort)(sVar21 < sVar17) * sVar17 | (ushort)(sVar21 >= sVar17) * sVar21;
  sVar19 = auVar76._2_2_;
  sVar22 = auVar76._10_2_;
  auVar18._2_2_ = (ushort)(sVar22 < sVar19) * sVar19 | (ushort)(sVar22 >= sVar19) * sVar22;
  sVar20 = auVar76._4_2_;
  sVar23 = auVar76._12_2_;
  auVar18._4_2_ = (ushort)(sVar23 < sVar20) * sVar20 | (ushort)(sVar23 >= sVar20) * sVar23;
  sVar20 = auVar76._6_2_;
  sVar24 = auVar76._14_2_;
  auVar18._6_2_ = (ushort)(sVar24 < sVar20) * sVar20 | (ushort)(sVar24 >= sVar20) * sVar24;
  auVar18._8_2_ = (ushort)(sVar17 < sVar21) * sVar21 | (ushort)(sVar17 >= sVar21) * sVar17;
  auVar18._10_2_ = (ushort)(sVar19 < sVar22) * sVar22 | (ushort)(sVar19 >= sVar22) * sVar19;
  auVar18._12_2_ = (ushort)(sVar17 < sVar23) * sVar23 | (ushort)(sVar17 >= sVar23) * sVar17;
  auVar18._14_2_ = (ushort)(sVar19 < sVar24) * sVar24 | (ushort)(sVar19 >= sVar24) * sVar19;
  auVar76 = pshuflw(auVar76,auVar18,0xe);
  sVar17 = auVar76._0_2_;
  auVar29._0_2_ =
       (sVar17 < (short)auVar18._0_2_) * auVar18._0_2_ |
       (ushort)(sVar17 >= (short)auVar18._0_2_) * sVar17;
  sVar17 = auVar76._2_2_;
  auVar29._2_2_ =
       (sVar17 < (short)auVar18._2_2_) * auVar18._2_2_ |
       (ushort)(sVar17 >= (short)auVar18._2_2_) * sVar17;
  sVar17 = auVar76._4_2_;
  auVar29._4_2_ =
       (sVar17 < (short)auVar18._4_2_) * auVar18._4_2_ |
       (ushort)(sVar17 >= (short)auVar18._4_2_) * sVar17;
  sVar17 = auVar76._6_2_;
  auVar29._6_2_ =
       (sVar17 < (short)auVar18._6_2_) * auVar18._6_2_ |
       (ushort)(sVar17 >= (short)auVar18._6_2_) * sVar17;
  sVar17 = auVar76._8_2_;
  auVar29._8_2_ =
       (sVar17 < (short)auVar18._8_2_) * auVar18._8_2_ |
       (ushort)(sVar17 >= (short)auVar18._8_2_) * sVar17;
  sVar17 = auVar76._10_2_;
  auVar29._10_2_ =
       (sVar17 < (short)auVar18._10_2_) * auVar18._10_2_ |
       (ushort)(sVar17 >= (short)auVar18._10_2_) * sVar17;
  sVar17 = auVar76._12_2_;
  sVar19 = auVar76._14_2_;
  auVar29._12_2_ =
       (sVar17 < (short)auVar18._12_2_) * auVar18._12_2_ |
       (ushort)(sVar17 >= (short)auVar18._12_2_) * sVar17;
  auVar29._14_2_ =
       (sVar19 < (short)auVar18._14_2_) * auVar18._14_2_ |
       (ushort)(sVar19 >= (short)auVar18._14_2_) * sVar19;
  auVar76 = pshuflw(auVar18,auVar29,1);
  sVar17 = auVar76._2_2_;
  *eob_ptr = (sVar17 < (short)auVar29._2_2_) * auVar29._2_2_ |
             (ushort)(sVar17 >= (short)auVar29._2_2_) * sVar17;
  return;
}

Assistant:

void aom_quantize_b_64x64_ssse3(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i two = _mm_set1_epi16(2);
  int index;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, all_zero;
  __m128i eob = zero, eob0;

  (void)scan;
  (void)n_coeffs;

  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, two);
  round = _mm_add_epi16(round, two);
  zbin = _mm_srli_epi16(zbin, 2);
  round = _mm_srli_epi16(round, 2);
  zbin = _mm_sub_epi16(zbin, one);
  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  qcoeff0 = _mm_abs_epi16(coeff0);
  qcoeff1 = _mm_abs_epi16(coeff1);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_64x64(&qcoeff0, round, quant, &shift);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_64x64(&qcoeff1, round, quant, &shift);

    // Reinsert signs.
    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    // Mask out zbin threshold coeffs.
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_64x64(qcoeff0, dequant, zero, dqcoeff_ptr);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_64x64(qcoeff1, dequant, zero, dqcoeff_ptr + 8);

    eob =
        scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, 0, zero);
  }

  // AC only loop.
  for (index = 16; index < 1024; index += 16) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    qcoeff0 = _mm_abs_epi16(coeff0);
    qcoeff1 = _mm_abs_epi16(coeff1);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      continue;
    }
    calculate_qcoeff_64x64(&qcoeff0, round, quant, &shift);
    calculate_qcoeff_64x64(&qcoeff1, round, quant, &shift);

    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_64x64(qcoeff0, dequant, zero,
                                      dqcoeff_ptr + index);
    calculate_dqcoeff_and_store_64x64(qcoeff1, dequant, zero,
                                      dqcoeff_ptr + 8 + index);

    eob0 = scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, index,
                        zero);
    eob = _mm_max_epi16(eob, eob0);
  }

  *eob_ptr = accumulate_eob(eob);
}